

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::FileOutputStream::CopyingFileOutputStream::Write
          (CopyingFileOutputStream *this,void *buffer,int size)

{
  undefined1 extraout_AL;
  uint uVar1;
  uint uVar2;
  ssize_t sVar3;
  int *piVar4;
  int block_size;
  CopyingFileOutputStream *this_00;
  int iVar5;
  
  if (this->is_closed_ != false) {
    this_00 = (CopyingFileOutputStream *)&stack0xffffffffffffffc0;
    Write(this_00);
    (this_00->super_CopyingOutputStream)._vptr_CopyingOutputStream =
         (_func_int **)&PTR__IstreamInputStream_004d1e30;
    IstreamInputStream::CopyingIstreamInputStream::CopyingIstreamInputStream
              ((CopyingIstreamInputStream *)&this_00->file_,(istream *)buffer);
    CopyingInputStreamAdaptor::CopyingInputStreamAdaptor
              ((CopyingInputStreamAdaptor *)(this_00 + 1),(CopyingInputStream *)&this_00->file_,
               block_size);
    return (bool)extraout_AL;
  }
  uVar2 = 0;
  do {
    uVar1 = uVar2;
    if (size - uVar1 == 0 || size < (int)uVar1) break;
    do {
      sVar3 = write(this->file_,(void *)((ulong)uVar1 + (long)buffer),(long)(int)(size - uVar1));
      iVar5 = (int)sVar3;
      if (-1 < iVar5) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    if (iVar5 < 1) {
      uVar2 = uVar1;
      if (iVar5 < 0) {
        piVar4 = __errno_location();
        this->errno_ = *piVar4;
      }
    }
    else {
      uVar2 = uVar1 + iVar5;
    }
  } while (0 < iVar5);
  return size <= (int)uVar1;
}

Assistant:

bool FileOutputStream::CopyingFileOutputStream::Write(const void* buffer,
                                                      int size) {
  ABSL_CHECK(!is_closed_);
  int total_written = 0;

  const uint8_t* buffer_base = reinterpret_cast<const uint8_t*>(buffer);

  while (total_written < size) {
    int bytes;
    do {
      bytes = write(file_, buffer_base + total_written, size - total_written);
    } while (bytes < 0 && errno == EINTR);

    if (bytes <= 0) {
      // Write error.

      // FIXME(kenton):  According to the man page, if write() returns zero,
      //   there was no error; write() simply did not write anything.  It's
      //   unclear under what circumstances this might happen, but presumably
      //   errno won't be set in this case.  I am confused as to how such an
      //   event should be handled.  For now I'm treating it as an error, since
      //   retrying seems like it could lead to an infinite loop.  I suspect
      //   this never actually happens anyway.

      if (bytes < 0) {
        errno_ = errno;
      }
      return false;
    }
    total_written += bytes;
  }

  return true;
}